

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

size_t CountWitnessSigOps(CScript *scriptSig,CScript *scriptPubKey,CScriptWitness *witness,
                         uint flags)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  CScriptWitness *pCVar4;
  const_iterator end;
  CScript *pCVar5;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  const_iterator pc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witnessprogram;
  int witnessversion;
  CScript subscript;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  const_iterator local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  int local_5c;
  direct_or_indirect local_58;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (CountWitnessSigOps(CScript_const&,CScript_const&,CScriptWitness_const*,unsigned_int)::
      witnessEmpty == '\0') {
    CountWitnessSigOps();
  }
  if ((flags >> 0xb & 1) == 0) {
    scriptSig = (CScript *)0x0;
    goto LAB_0079b93f;
  }
  if ((flags & 1) == 0) {
    __assert_fail("(flags & SCRIPT_VERIFY_P2SH) != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/interpreter.cpp"
                  ,0x836,
                  "size_t CountWitnessSigOps(const CScript &, const CScript &, const CScriptWitness *, unsigned int)"
                 );
  }
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = CScript::IsWitnessProgram(scriptPubKey,&local_5c,&local_78);
  if (bVar2) {
    pCVar4 = &CountWitnessSigOps::witnessEmpty;
    if (witness != (CScriptWitness *)0x0) {
      pCVar4 = witness;
    }
    scriptSig = (CScript *)WitnessSigOps(local_5c,&local_78,pCVar4);
  }
  else {
    bVar2 = CScript::IsPayToScriptHash(scriptPubKey);
    if (bVar2) {
      bVar2 = CScript::IsPushOnly(scriptSig);
      if (bVar2) {
        local_80.ptr = (uchar *)scriptSig;
        if (0x1c < (scriptSig->super_CScriptBase)._size) {
          local_80.ptr = (uchar *)(scriptSig->super_CScriptBase)._union.indirect_contents.indirect;
        }
        local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (uchar *)0x0;
        local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (uchar *)0x0;
        local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar1 = (scriptSig->super_CScriptBase)._size;
        uVar3 = uVar1 - 0x1d;
        if (uVar1 < 0x1d) {
          uVar3 = uVar1;
        }
        pCVar5 = (CScript *)(scriptSig->super_CScriptBase)._union.indirect_contents.indirect;
        if (uVar1 < 0x1d) {
          pCVar5 = scriptSig;
        }
        end.ptr = (uchar *)((long)&(pCVar5->super_CScriptBase)._union + (long)(int)uVar3);
        if (local_80.ptr < end.ptr) {
          do {
            GetScriptOp(&local_80,end,(opcodetype *)local_58.direct,&local_98);
            uVar1 = (scriptSig->super_CScriptBase)._size;
            uVar3 = uVar1 - 0x1d;
            if (uVar1 < 0x1d) {
              uVar3 = uVar1;
            }
            pCVar5 = (CScript *)(scriptSig->super_CScriptBase)._union.indirect_contents.indirect;
            if (uVar1 < 0x1d) {
              pCVar5 = scriptSig;
            }
            end.ptr = (uchar *)((long)&(pCVar5->super_CScriptBase)._union + (long)(int)uVar3);
          } while (local_80.ptr < end.ptr);
        }
        prevector<28U,_unsigned_char,_unsigned_int,_int>::
        prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_58.indirect_contents,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
        bVar2 = CScript::IsWitnessProgram
                          ((CScript *)&local_58.indirect_contents,&local_5c,&local_78);
        if (bVar2) {
          pCVar4 = &CountWitnessSigOps::witnessEmpty;
          if (witness != (CScriptWitness *)0x0) {
            pCVar4 = witness;
          }
          scriptSig = (CScript *)WitnessSigOps(local_5c,&local_78,pCVar4);
        }
        if (0x1c < local_3c) {
          free(local_58.indirect_contents.indirect);
          local_58.indirect_contents.indirect = (char *)0x0;
        }
        if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_98.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_98.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (bVar2) goto LAB_0079b928;
      }
    }
    scriptSig = (CScript *)0x0;
  }
LAB_0079b928:
  if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
LAB_0079b93f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (size_t)scriptSig;
  }
  __stack_chk_fail();
}

Assistant:

size_t CountWitnessSigOps(const CScript& scriptSig, const CScript& scriptPubKey, const CScriptWitness* witness, unsigned int flags)
{
    static const CScriptWitness witnessEmpty;

    if ((flags & SCRIPT_VERIFY_WITNESS) == 0) {
        return 0;
    }
    assert((flags & SCRIPT_VERIFY_P2SH) != 0);

    int witnessversion;
    std::vector<unsigned char> witnessprogram;
    if (scriptPubKey.IsWitnessProgram(witnessversion, witnessprogram)) {
        return WitnessSigOps(witnessversion, witnessprogram, witness ? *witness : witnessEmpty);
    }

    if (scriptPubKey.IsPayToScriptHash() && scriptSig.IsPushOnly()) {
        CScript::const_iterator pc = scriptSig.begin();
        std::vector<unsigned char> data;
        while (pc < scriptSig.end()) {
            opcodetype opcode;
            scriptSig.GetOp(pc, opcode, data);
        }
        CScript subscript(data.begin(), data.end());
        if (subscript.IsWitnessProgram(witnessversion, witnessprogram)) {
            return WitnessSigOps(witnessversion, witnessprogram, witness ? *witness : witnessEmpty);
        }
    }

    return 0;
}